

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_types.h
# Opt level: O2

kvs_ops_stat * __thiscall kvs_ops_stat::operator=(kvs_ops_stat *this,kvs_ops_stat *ops_stat)

{
  (this->num_sets).super___atomic_base<unsigned_long>._M_i =
       (ops_stat->num_sets).super___atomic_base<unsigned_long>._M_i;
  (this->num_dels).super___atomic_base<unsigned_long>._M_i =
       (ops_stat->num_dels).super___atomic_base<unsigned_long>._M_i;
  (this->num_commits).super___atomic_base<unsigned_long>._M_i =
       (ops_stat->num_commits).super___atomic_base<unsigned_long>._M_i;
  (this->num_compacts).super___atomic_base<unsigned_long>._M_i =
       (ops_stat->num_compacts).super___atomic_base<unsigned_long>._M_i;
  (this->num_gets).super___atomic_base<unsigned_long>._M_i =
       (ops_stat->num_gets).super___atomic_base<unsigned_long>._M_i;
  (this->num_iterator_gets).super___atomic_base<unsigned_long>._M_i =
       (ops_stat->num_iterator_gets).super___atomic_base<unsigned_long>._M_i;
  (this->num_iterator_moves).super___atomic_base<unsigned_long>._M_i =
       (ops_stat->num_iterator_moves).super___atomic_base<unsigned_long>._M_i;
  return this;
}

Assistant:

kvs_ops_stat& operator=(const kvs_ops_stat& ops_stat) {
        atomic_store_uint64_t(&num_sets,
                              atomic_get_uint64_t(&ops_stat.num_sets,
                                                  std::memory_order_relaxed),
                              std::memory_order_relaxed);
        atomic_store_uint64_t(&num_dels,
                              atomic_get_uint64_t(&ops_stat.num_dels,
                                                  std::memory_order_relaxed),
                              std::memory_order_relaxed);
        atomic_store_uint64_t(&num_commits,
                              atomic_get_uint64_t(&ops_stat.num_commits,
                                                  std::memory_order_relaxed),
                              std::memory_order_relaxed);
        atomic_store_uint64_t(&num_compacts,
                              atomic_get_uint64_t(&ops_stat.num_compacts,
                                                  std::memory_order_relaxed),
                              std::memory_order_relaxed);
        atomic_store_uint64_t(&num_gets,
                              atomic_get_uint64_t(&ops_stat.num_gets,
                                                  std::memory_order_relaxed),
                              std::memory_order_relaxed);
        atomic_store_uint64_t(&num_iterator_gets,
                              atomic_get_uint64_t(&ops_stat.num_iterator_gets,
                                                  std::memory_order_relaxed),
                              std::memory_order_relaxed);
        atomic_store_uint64_t(&num_iterator_moves,
                              atomic_get_uint64_t(&ops_stat.num_iterator_moves,
                                                  std::memory_order_relaxed),
                              std::memory_order_relaxed);
        return *this;
    }